

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O1

void V_RefreshViewBorder(void)

{
  int iVar1;
  FTexture *pFVar2;
  uint uVar3;
  
  if (setblocks < 10) {
    if (BorderNeedRefresh == 0) {
      if (BorderTopRefresh != 0) {
        BorderTopRefresh = BorderTopRefresh + -1;
        iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
        if (viewwidth != iVar1) {
          if (viewwindowy < 0x22) {
            uVar3 = (uint)gameinfo.Border.offset;
            V_DrawBorder(0,0,viewwindowx,0x22);
            V_DrawBorder(viewwindowx,0,viewwidth + viewwindowx,viewwindowy);
            V_DrawBorder(viewwidth + viewwindowx,0,(screen->super_DSimpleCanvas).super_DCanvas.Width
                         ,0x22);
            pFVar2 = FTextureManager::operator()(&TexMan,gameinfo.Border.t.Chars);
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                      (screen,(ulong)(uint)viewwindowx,(ulong)(viewwindowy - (uint)pFVar2->Height),
                       (ulong)(uint)(viewwidth + viewwindowx),(ulong)(uint)viewwindowy,pFVar2,1);
            pFVar2 = FTextureManager::operator()(&TexMan,gameinfo.Border.l.Chars);
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                      (screen,(ulong)(viewwindowx - (uint)pFVar2->Width),(ulong)(uint)viewwindowy,
                       (ulong)(uint)viewwindowx,0x23,pFVar2,1);
            pFVar2 = FTextureManager::operator()(&TexMan,gameinfo.Border.r.Chars);
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                      (screen,(ulong)(uint)(viewwidth + viewwindowx),(ulong)(uint)viewwindowy,
                       (ulong)((uint)pFVar2->Width + viewwidth + viewwindowx),0x23,pFVar2,1);
            pFVar2 = FTextureManager::operator()(&TexMan,gameinfo.Border.tl.Chars);
            DCanvas::DrawTexture
                      ((DCanvas *)screen,pFVar2,(double)(int)(viewwindowx - uVar3),
                       (double)(int)(viewwindowy - uVar3),0);
            pFVar2 = FTextureManager::operator()(&TexMan,gameinfo.Border.tr.Chars);
            DCanvas::DrawTexture
                      ((DCanvas *)screen,pFVar2,(double)(viewwidth + viewwindowx),
                       (double)(int)(viewwindowy - uVar3),0);
            return;
          }
          V_DrawBorder(0,0,iVar1,0x22);
          return;
        }
      }
    }
    else {
      BorderNeedRefresh = BorderNeedRefresh + -1;
      if (BorderTopRefresh != 0) {
        BorderTopRefresh = BorderTopRefresh + -1;
      }
      if (0x140 < (screen->super_DSimpleCanvas).super_DCanvas.Width) {
        ST_SetNeedRefresh();
      }
      iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      if (viewwidth != iVar1) {
        V_DrawBorder(0,0,iVar1,viewwindowy);
        V_DrawBorder(0,viewwindowy,viewwindowx,viewheight + viewwindowy);
        V_DrawBorder(viewwidth + viewwindowx,viewwindowy,
                     (screen->super_DSimpleCanvas).super_DCanvas.Width,viewheight + viewwindowy);
        V_DrawBorder(0,viewheight + viewwindowy,(screen->super_DSimpleCanvas).super_DCanvas.Width,
                     ST_Y);
        V_DrawFrame(viewwindowx,viewwindowy,viewwidth,viewheight);
        V_MarkRect(0,0,(screen->super_DSimpleCanvas).super_DCanvas.Width,ST_Y);
        return;
      }
    }
  }
  return;
}

Assistant:

void V_RefreshViewBorder ()
{
	if (setblocks < 10)
	{
		if (BorderNeedRefresh)
		{
			BorderNeedRefresh--;
			if (BorderTopRefresh)
			{
				BorderTopRefresh--;
			}
			V_DrawViewBorder();
		}
		else if (BorderTopRefresh)
		{
			BorderTopRefresh--;
			V_DrawTopBorder();
		}
	}
}